

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_12ea4::CompressZip
               (uchar *dst,unsigned_long_long *compressedSize,uchar *src,unsigned_long srcSize)

{
  value_type vVar1;
  char cVar2;
  reference pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  mz_ulong mVar4;
  mz_ulong *pDest_len;
  long in_RCX;
  value_type *pvVar5;
  value_type *in_RDX;
  mz_ulong *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int ret;
  mz_ulong outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  value_type *local_70;
  value_type *local_60;
  reference local_58;
  value_type *local_18;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12b596);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12b5bc);
  local_58 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff30,
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff30,
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_60 = pvVar3 + (in_RCX + 1U >> 1);
  local_18 = in_RDX;
  while (local_18 < in_RDX + in_RCX) {
    pvVar5 = local_18 + 1;
    *local_58 = *local_18;
    if (in_RDX + in_RCX <= pvVar5) break;
    local_18 = local_18 + 2;
    *local_60 = *pvVar5;
    local_60 = local_60 + 1;
    local_58 = local_58 + 1;
  }
  local_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff30,
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                   (in_stack_ffffffffffffff30,
                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  vVar1 = *local_70;
  while (local_70 = local_70 + 1,
        local_70 <
        (value_type *)
        ((long)&(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + in_RCX)) {
    cVar2 = *local_70 - vVar1;
    vVar1 = *local_70;
    *local_70 = cVar2 + 0x80;
  }
  mVar4 = mz_compressBound(0x12b7b6);
  pDest_len = (mz_ulong *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                        (in_RDI,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  mz_compress((uchar *)this,pDest_len,(uchar *)in_RDI,
              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *in_RSI = mVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

void CompressZip(unsigned char *dst, unsigned long long &compressedSize,
                 const unsigned char *src, unsigned long srcSize) {

  std::vector<unsigned char> tmpBuf(srcSize);

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  //
  // Reorder the pixel data.
  //

  {
    char *t1 = (char *)&tmpBuf.at(0);
    char *t2 = (char *)&tmpBuf.at(0) + (srcSize + 1) / 2;
    const char *stop = (const char *)src + srcSize;

    for (;;) {
      if ((const char *)src < stop)
        *(t1++) = *(src++);
      else
        break;

      if ((const char *)src < stop)
        *(t2++) = *(src++);
      else
        break;
    }
  }

  //
  // Predictor.
  //

  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + srcSize;
    int p = t[-1];

    while (t < stop) {
      int d = int(t[0]) - p + (128 + 256);
      p = t[0];
      t[0] = d;
      ++t;
    }
  }

  //
  // Compress the data using miniz
  //

  miniz::mz_ulong outSize = miniz::mz_compressBound(srcSize);
  int ret = miniz::mz_compress(dst, &outSize,
                               (const unsigned char *)&tmpBuf.at(0), srcSize);
  assert(ret == miniz::MZ_OK);
  (void)ret;

  compressedSize = outSize;
}